

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O3

void * buffer_malloc(size_t amount)

{
  long lVar1;
  ulong uVar2;
  char *msg;
  
  if (startup == 0) {
    msg = "unexpected buffer_malloc()";
  }
  else {
    uVar2 = amount + 3 & 0xfffffffffffffffc;
    lVar1 = (long)malloc_total;
    if (uVar2 + lVar1 < 0x10000) {
      malloc_total = (int)uVar2 + malloc_total;
      return malloc_headroom + lVar1;
    }
    msg = "out of buffer space during initialisation";
  }
  die(msg);
}

Assistant:

static void * buffer_malloc(size_t amount) {
    // Only use buffer_malloc before we can use proper malloc...
    if (startup == 0)
        die("unexpected buffer_malloc()");

    amount = (amount + 3) & ~3; // round up to 4-byte aligned value.

    // space in buffer?
    if (amount + malloc_total >= sizeof malloc_headroom)
        die("out of buffer space during initialisation");

    // consume and return that much of the malloc_headroom
    void *p = malloc_headroom + malloc_total;
    malloc_total += amount;
    return p;
}